

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitm.c
# Opt level: O0

int fightm(monst *mtmp)

{
  boolean bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  bool bVar6;
  int has_u_swallowed;
  int result;
  monst *nmon;
  monst *mon;
  monst *mtmp_local;
  
  iVar3 = resist(mtmp,'\x04',0,0);
  if ((iVar3 == 0) && ((u.ustuck != mtmp || (bVar1 = itsstuck(mtmp), bVar1 == '\0')))) {
    bVar2 = u._1052_1_ & 1;
    bVar6 = mtmp == u.ustuck;
    nmon = level->monlist;
    while (nmon != (monst *)0x0) {
      _has_u_swallowed = nmon->nmon;
      if (_has_u_swallowed == mtmp) {
        _has_u_swallowed = mtmp->nmon;
      }
      if (((nmon != mtmp) && (0 < nmon->mhp)) &&
         (bVar1 = monnear(mtmp,(int)nmon->mx,(int)nmon->my), bVar1 != '\0')) {
        if (((u._1052_1_ & 1) == 0) && (mtmp == u.ustuck)) {
          iVar3 = rn2(4);
          if (iVar3 != 0) {
            return 0;
          }
          pcVar5 = Monnam(mtmp);
          pline("%s releases you!",pcVar5);
          u.ustuck = (monst *)0x0;
          u._1052_1_ = u._1052_1_ & 0x7f;
        }
        bhitpos.x = nmon->mx;
        bhitpos.y = nmon->my;
        notonhead = '\0';
        uVar4 = mattackm(mtmp,nmon);
        if ((uVar4 & 4) == 0) {
          if (bVar2 != 0 && bVar6) {
            return 0;
          }
          if ((((uVar4 & 1) != 0) && ((uVar4 & 2) == 0)) &&
             ((iVar3 = rn2(4), iVar3 != 0 && (0xb < nmon->movement)))) {
            nmon->movement = nmon->movement + -0xc;
            notonhead = '\0';
            mattackm(nmon,mtmp);
          }
          return (uint)((uVar4 & 1) != 0);
        }
        return 1;
      }
      nmon = _has_u_swallowed;
    }
  }
  return 0;
}

Assistant:

int fightm(struct monst *mtmp)		/* have monsters fight each other */
{
	struct monst *mon, *nmon;
	int result, has_u_swallowed;

	/* perhaps the monster will resist Conflict */
	if (resist(mtmp, RING_CLASS, 0, 0))
	    return 0;

	if (u.ustuck == mtmp) {
	    /* perhaps we're holding it... */
	    if (itsstuck(mtmp))
		return 0;
	}
	has_u_swallowed = (u.uswallow && (mtmp == u.ustuck));

	for (mon = level->monlist; mon; mon = nmon) {
	    nmon = mon->nmon;
	    if (nmon == mtmp) nmon = mtmp->nmon;
	    /* Be careful to ignore monsters that are already dead, since we
	     * might be calling this before we've cleaned them up.  This can
	     * happen if the monster attacked a cockatrice bare-handedly, for
	     * instance.
	     */
	    if (mon != mtmp && !DEADMONSTER(mon)) {
		if (monnear(mtmp,mon->mx,mon->my)) {
		    if (!u.uswallow && (mtmp == u.ustuck)) {
			if (!rn2(4)) {
			    pline("%s releases you!", Monnam(mtmp));
			    u.ustuck = 0;
			    u.uwilldrown = 0;
			} else
			    break;
		    }

		    /* mtmp can be killed */
		    bhitpos.x = mon->mx;
		    bhitpos.y = mon->my;
		    notonhead = 0;
		    result = mattackm(mtmp,mon);

		    if (result & MM_AGR_DIED) return 1;	/* mtmp died */
		    /*
		     *  If mtmp has the hero swallowed, lie and say there
		     *  was no attack (this allows mtmp to digest the hero).
		     */
		    if (has_u_swallowed) return 0;

		    /* Allow attacked monsters a chance to hit back. Primarily
		     * to allow monsters that resist conflict to respond.
		     */
		    if ((result & MM_HIT) && !(result & MM_DEF_DIED) &&
			rn2(4) && mon->movement >= NORMAL_SPEED) {
			mon->movement -= NORMAL_SPEED;
			notonhead = 0;
			mattackm(mon, mtmp);	/* return attack */
		    }

		    return (result & MM_HIT) ? 1 : 0;
		}
	    }
	}
	return 0;
}